

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O3

void __thiscall
VW::config::typed_option<char>::typed_option(typed_option<char> *this,string *name,char *location)

{
  pointer pcVar1;
  size_t type_hash;
  string local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  type_hash = std::type_info::hash_code((type_info *)&char::typeinfo);
  base_option::base_option(&this->super_base_option,&local_40,type_hash);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_base_option)._vptr_base_option = (_func_int **)&PTR__typed_option_002ed748;
  this->m_location = location;
  (this->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_default_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}